

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builtins.h
# Opt level: O2

void __thiscall slang::ast::builtins::Builtins::Builtins(Builtins *this)

{
  ScalarType::ScalarType(&this->bitType,Bit);
  ScalarType::ScalarType(&this->logicType,Logic);
  ScalarType::ScalarType(&this->regType,Reg);
  ScalarType::ScalarType(&this->signedBitType,Bit,true);
  ScalarType::ScalarType(&this->signedLogicType,Logic,true);
  ScalarType::ScalarType(&this->signedRegType,Reg,true);
  PredefinedIntegerType::PredefinedIntegerType(&this->intType,Int);
  PredefinedIntegerType::PredefinedIntegerType(&this->uintType,Int,false);
  PredefinedIntegerType::PredefinedIntegerType(&this->byteType,Byte);
  PredefinedIntegerType::PredefinedIntegerType(&this->integerType,Integer);
  PredefinedIntegerType::PredefinedIntegerType(&this->shortIntType,ShortInt);
  PredefinedIntegerType::PredefinedIntegerType(&this->longIntType,LongInt);
  PredefinedIntegerType::PredefinedIntegerType(&this->ulongIntType,LongInt,false);
  PredefinedIntegerType::PredefinedIntegerType(&this->timeType,Time);
  FloatingType::FloatingType(&this->realType,Real);
  FloatingType::FloatingType(&this->shortRealType,ShortReal);
  FloatingType::FloatingType(&this->realTimeType,RealTime);
  (this->stringType).super_Type.super_Symbol.kind = StringType;
  (this->stringType).super_Type.super_Symbol.name._M_len = 6;
  (this->stringType).super_Type.super_Symbol.name._M_str = "string";
  (this->stringType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->stringType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->stringType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->stringType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->stringType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->stringType).super_Type.canonical = &(this->stringType).super_Type;
  (this->voidType).super_Type.super_Symbol.kind = VoidType;
  (this->voidType).super_Type.super_Symbol.name._M_len = 4;
  (this->voidType).super_Type.super_Symbol.name._M_str = "void";
  (this->voidType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->voidType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->voidType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->voidType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->voidType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->voidType).super_Type.canonical = &(this->voidType).super_Type;
  (this->chandleType).super_Type.super_Symbol.kind = CHandleType;
  (this->chandleType).super_Type.super_Symbol.name._M_len = 7;
  (this->chandleType).super_Type.super_Symbol.name._M_str = "chandle";
  (this->chandleType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->chandleType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->chandleType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->chandleType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->chandleType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->chandleType).super_Type.canonical = &(this->chandleType).super_Type;
  (this->nullType).super_Type.super_Symbol.kind = NullType;
  (this->nullType).super_Type.super_Symbol.name._M_len = 4;
  (this->nullType).super_Type.super_Symbol.name._M_str = "null";
  (this->nullType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->nullType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->nullType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->nullType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->nullType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->nullType).super_Type.canonical = &(this->nullType).super_Type;
  (this->eventType).super_Type.super_Symbol.kind = EventType;
  (this->eventType).super_Type.super_Symbol.name._M_len = 5;
  (this->eventType).super_Type.super_Symbol.name._M_str = "event";
  (this->eventType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->eventType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->eventType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->eventType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->eventType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->eventType).super_Type.canonical = &(this->eventType).super_Type;
  (this->unboundedType).super_Type.super_Symbol.kind = UnboundedType;
  (this->unboundedType).super_Type.super_Symbol.name._M_len = 1;
  (this->unboundedType).super_Type.super_Symbol.name._M_str = "$";
  (this->unboundedType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  *(undefined8 *)((long)&(this->unboundedType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->unboundedType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->unboundedType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->unboundedType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  (this->unboundedType).super_Type.canonical = &(this->unboundedType).super_Type;
  (this->typeRefType).super_Type.super_Symbol.kind = TypeRefType;
  (this->typeRefType).super_Type.super_Symbol.name._M_len = 0xe;
  (this->typeRefType).super_Type.super_Symbol.name._M_str = "type reference";
  (this->typeRefType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  *(undefined8 *)((long)&(this->typeRefType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->typeRefType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->typeRefType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->typeRefType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  (this->typeRefType).super_Type.canonical = &(this->typeRefType).super_Type;
  (this->untypedType).super_Type.super_Symbol.kind = UntypedType;
  (this->untypedType).super_Type.super_Symbol.name._M_len = 7;
  (this->untypedType).super_Type.super_Symbol.name._M_str = "untyped";
  (this->untypedType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  *(undefined8 *)((long)&(this->untypedType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->untypedType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->untypedType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->untypedType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  (this->untypedType).super_Type.canonical = &(this->untypedType).super_Type;
  (this->sequenceType).super_Type.super_Symbol.kind = SequenceType;
  (this->sequenceType).super_Type.super_Symbol.name._M_len = 8;
  (this->sequenceType).super_Type.super_Symbol.name._M_str = "sequence";
  (this->sequenceType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  *(undefined8 *)((long)&(this->sequenceType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->sequenceType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->sequenceType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->sequenceType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  (this->sequenceType).super_Type.canonical = &(this->sequenceType).super_Type;
  (this->propertyType).super_Type.super_Symbol.kind = PropertyType;
  (this->propertyType).super_Type.super_Symbol.name._M_len = 8;
  (this->propertyType).super_Type.super_Symbol.name._M_str = "property";
  (this->propertyType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  *(undefined8 *)((long)&(this->propertyType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->propertyType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->propertyType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->propertyType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  (this->propertyType).super_Type.canonical = &(this->propertyType).super_Type;
  (this->errorType).super_Type.super_Symbol.kind = ErrorType;
  (this->errorType).super_Type.super_Symbol.name._M_len = 0;
  (this->errorType).super_Type.super_Symbol.name._M_str = "";
  (this->errorType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  *(undefined8 *)((long)&(this->errorType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->errorType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->errorType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->errorType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  (this->errorType).super_Type.canonical = &(this->errorType).super_Type;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::unordered_flat_map(&this->subroutineNameMap);
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::unordered_flat_map(&this->methodMap);
  std::
  vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ::resize(&this->systemSubroutines,0x11e);
  registerArrayMethods(this);
  registerConversionFuncs(this);
  registerCoverageFuncs(this);
  registerEnumMethods(this);
  registerMathFuncs(this);
  registerMiscSystemFuncs(this);
  registerNonConstFuncs(this);
  registerQueryFuncs(this);
  registerStringMethods(this);
  registerSystemTasks(this);
  return;
}

Assistant:

Builtins() {
        systemSubroutines.resize(parsing::KnownSystemName_traits::values.size());

        registerArrayMethods();
        registerConversionFuncs();
        registerCoverageFuncs();
        registerEnumMethods();
        registerMathFuncs();
        registerMiscSystemFuncs();
        registerNonConstFuncs();
        registerQueryFuncs();
        registerStringMethods();
        registerSystemTasks();
    }